

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalHashAggregate::FinalizeInternal
          (PhysicalHashAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p,bool check_distinct)

{
  const_reference this_00;
  reference this_01;
  type gstate_p_00;
  undefined3 in_register_00000089;
  size_type __n;
  
  if ((CONCAT31(in_register_00000089,check_distinct) == 0) ||
     ((this->distinct_collection_info).
      super_unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_false>._M_head_impl ==
      (DistinctAggregateCollectionInfo *)0x0)) {
    if ((this->groupings).
        super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        .
        super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->groupings).
        super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        .
        super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_00 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&this->groupings,__n);
        this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                            ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)
                             (gstate_p + 1),__n);
        gstate_p_00 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                      ::operator*(&this_01->table_state);
        RadixPartitionedHashTable::Finalize(&this_00->table_data,context,gstate_p_00);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->groupings).
                                    super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    .
                                    super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->groupings).
                                    super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    .
                                    super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x6db6db6db6db6db7));
    }
  }
  else {
    FinalizeDistinct(this,pipeline,event,context,gstate_p);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalHashAggregate::FinalizeInternal(Pipeline &pipeline, Event &event, ClientContext &context,
                                                         GlobalSinkState &gstate_p, bool check_distinct) const {
	auto &gstate = gstate_p.Cast<HashAggregateGlobalSinkState>();

	if (check_distinct && distinct_collection_info) {
		// There are distinct aggregates
		// If these are partitioned those need to be combined first
		// Then we Finalize again, skipping this step
		return FinalizeDistinct(pipeline, event, context, gstate_p);
	}

	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping = groupings[i];
		auto &grouping_gstate = gstate.grouping_states[i];
		grouping.table_data.Finalize(context, *grouping_gstate.table_state);
	}
	return SinkFinalizeType::READY;
}